

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall soplex::CLUFactor<double>::remaxCol(CLUFactor<double> *this,int p_col,int len)

{
  int n;
  Dring *pDVar1;
  int iVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    piVar7 = (this->u).col.max;
    iVar9 = len - piVar7[p_col];
    iVar6 = (this->u).col.used;
    if ((this->u).col.size - iVar6 < iVar9) {
      packColumns(this);
      piVar7 = (this->u).col.max;
      iVar2 = (this->u).col.size;
      iVar6 = (this->u).col.used;
      iVar9 = len - piVar7[p_col];
      if (((double)iVar2 < (double)len + (double)iVar6 * this->colMemMult) &&
         (n = len + iVar6 * 2, iVar2 < n)) {
        (this->u).col.size = n;
        spx_realloc<int*>(&(this->u).col.idx,n);
        iVar6 = (this->u).col.used;
        piVar7 = (this->u).col.max;
      }
    }
    (this->u).col.used = iVar6 + iVar9;
    piVar7[p_col] = len;
  }
  else {
    iVar6 = (this->u).col.used;
    if ((this->u).col.size - iVar6 < len) {
      packColumns(this);
      iVar9 = (this->u).col.size;
      iVar6 = (this->u).col.used;
      if (((double)iVar9 < (double)len + (double)iVar6 * this->colMemMult) &&
         (iVar2 = len + iVar6 * 2, iVar9 < iVar2)) {
        (this->u).col.size = iVar2;
        spx_realloc<int*>(&(this->u).col.idx,iVar2);
        iVar6 = (this->u).col.used;
      }
    }
    piVar7 = (this->u).col.start;
    iVar9 = piVar7[p_col];
    lVar8 = (long)iVar9;
    iVar2 = (this->u).col.len[p_col];
    piVar7[p_col] = iVar6;
    piVar7 = &(this->u).col.used;
    *piVar7 = *piVar7 + len;
    piVar7 = (this->u).col.max;
    pDVar1 = (this->u).col.elem + p_col;
    pDVar3 = pDVar1->prev;
    piVar7[pDVar3->idx] = piVar7[pDVar3->idx] + piVar7[p_col];
    piVar7[p_col] = len;
    pDVar4 = pDVar1->next;
    pDVar4->prev = pDVar3;
    pDVar3->next = pDVar4;
    pDVar3 = (this->u).col.list.prev;
    pDVar4 = pDVar3->next;
    pDVar1->next = pDVar4;
    pDVar4->prev = pDVar1;
    pDVar1->prev = pDVar3;
    pDVar3->next = pDVar1;
    if (0 < iVar2) {
      piVar5 = (this->u).col.idx;
      piVar7 = piVar5 + iVar6;
      do {
        *piVar7 = piVar5[lVar8];
        lVar8 = lVar8 + 1;
        piVar7 = piVar7 + 1;
      } while (lVar8 < iVar2 + iVar9);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}